

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O2

bool __thiscall SCCLiveness::FoldIndir(SCCLiveness *this,Instr *instr,Opnd *opnd)

{
  RegOpnd *pRVar1;
  bool bVar2;
  int32 left;
  undefined8 in_RAX;
  IndirOpnd *this_00;
  void *pvVar3;
  long lVar4;
  MemRefOpnd *newDst;
  RegOpnd *index;
  undefined8 uStack_28;
  int32 offset;
  
  uStack_28 = in_RAX;
  this_00 = IR::Opnd::AsIndirOpnd(opnd);
  pRVar1 = this_00->m_indexOpnd;
  if (pRVar1 != (RegOpnd *)0x0) {
    if (pRVar1->m_sym == (StackSym *)0x0) {
      return false;
    }
    bVar2 = StackSym::IsIntConst(pRVar1->m_sym);
    if (!bVar2) {
      return false;
    }
    left = StackSym::GetIntConstValue(pRVar1->m_sym);
    uStack_28 = CONCAT44(left,(undefined4)uStack_28);
    if (this_00->m_scale != 0) {
      bVar2 = Int32Math::Shl(left,(uint)this_00->m_scale,(int32 *)((long)&uStack_28 + 4));
      if (bVar2) {
        return false;
      }
      left = uStack_28._4_4_;
    }
    if (this_00->m_offset != 0) {
      bVar2 = Int32Math::Add(this_00->m_offset,left,(int32 *)((long)&uStack_28 + 4));
      if (bVar2) {
        return false;
      }
      left = uStack_28._4_4_;
    }
    this_00->m_offset = left;
    (this_00->super_Opnd).field_0xe = 0;
    IR::IndirOpnd::SetIndexOpnd(this_00,(RegOpnd *)0x0);
  }
  pRVar1 = this_00->m_baseOpnd;
  if (pRVar1 == (RegOpnd *)0x0) {
    pvVar3 = (void *)(long)this_00->m_offset;
LAB_005b0fb7:
    newDst = IR::MemRefOpnd::New(pvVar3,(this_00->super_Opnd).m_type,instr->m_func,
                                 AddrOpndKindDynamicMisc);
    if (this_00 == (IndirOpnd *)instr->m_dst) {
      IR::Instr::ReplaceDst(instr,&newDst->super_Opnd);
    }
    else {
      IR::Instr::ReplaceSrc(instr,&this_00->super_Opnd,&newDst->super_Opnd);
    }
    return true;
  }
  if ((((pRVar1->m_sym != (StackSym *)0x0) && (bVar2 = StackSym::IsConst(pRVar1->m_sym), bVar2)) &&
      (bVar2 = StackSym::IsIntConst(pRVar1->m_sym), !bVar2)) &&
     (bVar2 = StackSym::IsFloatConst(pRVar1->m_sym), !bVar2)) {
    pvVar3 = StackSym::GetConstAddress(pRVar1->m_sym,false);
    lVar4 = (long)this_00->m_offset;
    if (lVar4 < 0) {
      if (pvVar3 < (void *)(lVar4 + (long)pvVar3)) {
        return false;
      }
    }
    else if ((void *)(lVar4 + (long)pvVar3) < pvVar3) {
      return false;
    }
    pvVar3 = (void *)((long)pvVar3 + lVar4);
    if ((void *)(long)(int)pvVar3 == pvVar3) goto LAB_005b0fb7;
  }
  return false;
}

Assistant:

bool
SCCLiveness::FoldIndir(IR::Instr *instr, IR::Opnd *opnd)
{
#ifdef _M_ARM32_OR_ARM64
    // Can't be folded on ARM or ARM64
    return false;
#else
    IR::IndirOpnd *indir = opnd->AsIndirOpnd();

    if(indir->GetIndexOpnd())
    {
        IR::RegOpnd *index = indir->GetIndexOpnd();
        if (!index->m_sym || !index->m_sym->IsIntConst())
        {
            return false;
        }

        // offset = indir.offset + (index << scale)
        int32 offset = index->m_sym->GetIntConstValue();
        if((indir->GetScale() != 0 && Int32Math::Shl(offset, indir->GetScale(), &offset)) ||
           (indir->GetOffset() != 0 && Int32Math::Add(indir->GetOffset(), offset, &offset)))
        {
            return false;
        }
        indir->SetOffset(offset);
        indir->SetIndexOpnd(nullptr);
    }

    IR::RegOpnd *base = indir->GetBaseOpnd();
    uint8 *constValue = nullptr;
    if (base)
    {
        if (!base->m_sym || !base->m_sym->IsConst() || base->m_sym->IsIntConst() || base->m_sym->IsFloatConst())
        {
            return false;
        }
        constValue = static_cast<uint8 *>(base->m_sym->GetConstAddress());
        if (indir->GetOffset() < 0 ? constValue + indir->GetOffset() > constValue : constValue + indir->GetOffset() < constValue)
        {
            return false;
        }
    }
    constValue += indir->GetOffset();

#ifdef _M_X64
    // Encoding only allows 32bits worth
    if(!Math::FitsInDWord((size_t)constValue))
    {
        Assert(base != nullptr);
        return false;
    }
#endif

    IR::MemRefOpnd *memref = IR::MemRefOpnd::New(constValue, indir->GetType(), instr->m_func);

    if (indir == instr->GetDst())
    {
        instr->ReplaceDst(memref);
    }
    else
    {
        instr->ReplaceSrc(indir, memref);
    }
    return true;
#endif
}